

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

BranchInstr * __thiscall
Lowerer::GenerateFastBrConst(Lowerer *this,BranchInstr *branchInstr,Opnd *constOpnd,bool isEqual)

{
  code *pcVar1;
  bool bVar2;
  OpCode branchOpCode;
  undefined4 *puVar3;
  Opnd *pOVar4;
  RegOpnd *pRVar5;
  LabelInstr *target;
  BranchInstr *pBVar6;
  BranchInstr *newBranch;
  RegOpnd *opnd;
  bool isEqual_local;
  Opnd *constOpnd_local;
  BranchInstr *branchInstr_local;
  Lowerer *this_local;
  
  bVar2 = IR::Opnd::IsAddrOpnd(constOpnd);
  if (!bVar2) {
    bVar2 = IR::Opnd::IsIntConstOpnd(constOpnd);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xd1b,"(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd())",
                         "constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  pOVar4 = IR::Instr::GetSrc2(&branchInstr->super_Instr);
  pRVar5 = IR::Opnd::AsRegOpnd(pOVar4);
  bVar2 = IsConstRegOpnd(this,pRVar5);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xd28,"(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()))",
                       "IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
  pRVar5 = GetRegOpnd(this,pOVar4,&branchInstr->super_Instr,this->m_func,TyVar);
  branchOpCode = BrNeq_A;
  if (isEqual) {
    branchOpCode = BrEq_A;
  }
  target = IR::BranchInstr::GetTarget(branchInstr);
  pBVar6 = InsertCompareBranch(this,&pRVar5->super_Opnd,constOpnd,branchOpCode,target,
                               &branchInstr->super_Instr,false);
  return pBVar6;
}

Assistant:

IR::BranchInstr *
Lowerer::GenerateFastBrConst(IR::BranchInstr *branchInstr, IR::Opnd * constOpnd, bool isEqual)
{
    Assert(constOpnd->IsAddrOpnd() || constOpnd->IsIntConstOpnd());

    //
    // Given:
    // BrSrXx_A $L1, s1, s2
    // where s2 is either 'null', 'undefined', 'true' or 'false'
    //
    // Generate:
    //
    // CMP s1, s2
    // JEQ/JNE $L1
    //

    Assert(IsConstRegOpnd(branchInstr->GetSrc2()->AsRegOpnd()));

    IR::RegOpnd *opnd = GetRegOpnd(branchInstr->GetSrc1(), branchInstr, m_func, TyVar);

    IR::BranchInstr *newBranch;
    newBranch = InsertCompareBranch(opnd, constOpnd, isEqual ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A, branchInstr->GetTarget(), branchInstr);

    return newBranch;
}